

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.cpp
# Opt level: O0

vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *
computeIntersections
          (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
           *__return_storage_ptr__,vector<Node,_std::allocator<Node>_> *nodes,
          vector<bool,_std::allocator<bool>_> *removed)

{
  ulong uVar1;
  const_reference cVar2;
  bool bVar3;
  size_type sVar4;
  reference this;
  reference box;
  reference local_58;
  reference local_50;
  ulong local_48;
  size_t j;
  ulong local_30;
  size_t i;
  vector<bool,_std::allocator<bool>_> *local_20;
  vector<bool,_std::allocator<bool>_> *removed_local;
  vector<Node,_std::allocator<Node>_> *nodes_local;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *intersections;
  
  i._7_1_ = 0;
  local_20 = removed;
  removed_local = (vector<bool,_std::allocator<bool>_> *)nodes;
  nodes_local = (vector<Node,_std::allocator<Node>_> *)__return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x18);
  std::vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>::vector
            (__return_storage_ptr__);
  for (local_30 = 0; uVar1 = local_30,
      sVar4 = std::vector<Node,_std::allocator<Node>_>::size
                        ((vector<Node,_std::allocator<Node>_> *)removed_local), uVar1 < sVar4;
      local_30 = local_30 + 1) {
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(local_20);
    if ((sVar4 == 0) ||
       (cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](local_20,local_30), !cVar2)) {
      for (local_48 = 0; local_48 < local_30; local_48 = local_48 + 1) {
        sVar4 = std::vector<bool,_std::allocator<bool>_>::size(local_20);
        if ((sVar4 == 0) ||
           (cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](local_20,local_48), !cVar2)
           ) {
          this = std::vector<Node,_std::allocator<Node>_>::operator[]
                           ((vector<Node,_std::allocator<Node>_> *)removed_local,local_30);
          box = std::vector<Node,_std::allocator<Node>_>::operator[]
                          ((vector<Node,_std::allocator<Node>_> *)removed_local,local_48);
          bVar3 = quadtree::Box<float>::intersects(&this->box,&box->box);
          if (bVar3) {
            local_50 = std::vector<Node,_std::allocator<Node>_>::operator[]
                                 ((vector<Node,_std::allocator<Node>_> *)removed_local,local_30);
            local_58 = std::vector<Node,_std::allocator<Node>_>::operator[]
                                 ((vector<Node,_std::allocator<Node>_> *)removed_local,local_48);
            std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
            emplace_back<Node*,Node*>
                      ((vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)
                       __return_storage_ptr__,&local_50,&local_58);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Node*, Node*>> computeIntersections(std::vector<Node>& nodes, const std::vector<bool>& removed)
{
    auto intersections = std::vector<std::pair<Node*, Node*>>();
    for (auto i = std::size_t(0); i < nodes.size(); ++i)
    {
        if (removed.size() == 0 || !removed[i])
        {
            for (auto j = std::size_t(0); j < i; ++j)
            {
                if (removed.size() == 0 || !removed[j])
                {
                    if (nodes[i].box.intersects(nodes[j].box))
                        intersections.emplace_back(&nodes[i], &nodes[j]);
                }
            }
        }
    }
    return intersections;
}